

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O0

symtab * symtab_new(void)

{
  symtab *psVar1;
  int *piVar2;
  symtab *res;
  int i;
  
  psVar1 = (symtab *)calloc(0x20,1);
  psVar1->bucketsnum = 0x7f;
  piVar2 = (int *)malloc((long)psVar1->bucketsnum << 2);
  psVar1->buckets = piVar2;
  for (res._4_4_ = 0; res._4_4_ < psVar1->bucketsnum; res._4_4_ = res._4_4_ + 1) {
    psVar1->buckets[res._4_4_] = -1;
  }
  return psVar1;
}

Assistant:

struct symtab *symtab_new() {
	int i;
	struct symtab *res = calloc(sizeof *res, 1);
	res->bucketsnum = primes[0];
	res->buckets = malloc(sizeof *res->buckets * res->bucketsnum);
	for (i = 0; i < res->bucketsnum; i++)
		res->buckets[i] = -1;
	return res;
}